

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int envy_bios_parse_mem_train(envy_bios *bios)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  envy_bios_mem_train_entry *peVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  envy_bios_mem_train_entry *peVar17;
  bool bVar18;
  
  uVar3 = (bios->mem).train.offset;
  iVar13 = 0;
  if (uVar3 != 0) {
    uVar8 = bios->length;
    if (uVar3 < uVar8) {
      (bios->mem).train.version = bios->data[(uint)uVar3];
      iVar13 = 0;
    }
    else {
      (bios->mem).train.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar3 = (bios->mem).train.offset;
      uVar8 = bios->length;
      iVar13 = -0xe;
    }
    uVar11 = (ulong)uVar3;
    lVar9 = uVar11 + 1;
    if ((uint)lVar9 < uVar8) {
      (bios->mem).train.hlen = bios->data[lVar9];
      iVar15 = 0;
    }
    else {
      (bios->mem).train.hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
      uVar11 = (ulong)(bios->mem).train.offset;
      uVar8 = bios->length;
      iVar15 = -0xe;
    }
    lVar9 = uVar11 + 2;
    if ((uint)lVar9 < uVar8) {
      (bios->mem).train.rlen = bios->data[lVar9];
      iVar4 = 0;
    }
    else {
      (bios->mem).train.rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
      uVar11 = (ulong)(bios->mem).train.offset;
      uVar8 = bios->length;
      iVar4 = -0xe;
    }
    lVar9 = uVar11 + 3;
    if ((uint)lVar9 < uVar8) {
      (bios->mem).train.subentrylen = bios->data[lVar9];
      iVar5 = 0;
    }
    else {
      (bios->mem).train.subentrylen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
      uVar11 = (ulong)(bios->mem).train.offset;
      uVar8 = bios->length;
      iVar5 = -0xe;
    }
    uVar12 = (uint)uVar11;
    lVar9 = uVar11 + 4;
    if ((uint)lVar9 < uVar8) {
      (bios->mem).train.subentries = bios->data[lVar9];
      iVar6 = 0;
    }
    else {
      (bios->mem).train.subentries = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar9);
      uVar12 = (uint)(bios->mem).train.offset;
      uVar8 = bios->length;
      iVar6 = -0xe;
    }
    if ((uint)((ulong)uVar12 + 5) < uVar8) {
      (bios->mem).train.entriesnum = bios->data[(ulong)uVar12 + 5];
      iVar7 = 0;
    }
    else {
      (bios->mem).train.entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar7 = -0xe;
    }
    if (((((iVar15 == 0 && iVar13 == 0) && iVar4 == 0) && iVar5 == 0) && iVar6 == 0) && iVar7 == 0)
    {
      uVar3 = (bios->mem).train.offset;
      lVar9 = (ulong)uVar3 + 7;
      if ((uint)lVar9 < bios->length) {
        (bios->mem).train.mclk = CONCAT11(bios->data[lVar9],bios->data[(ulong)uVar3 + 6]);
      }
      else {
        (bios->mem).train.mclk = 0;
        fprintf(_stderr,"requested OOB u16 at 0x%04x\n");
        uVar3 = (bios->mem).train.offset;
      }
      envy_bios_block(bios,(uint)uVar3,
                      (uint)(bios->mem).train.entriesnum * (uint)(bios->mem).train.rlen +
                      (uint)(bios->mem).train.hlen,"MEM TRAIN",-1);
      bVar2 = (bios->mem).train.entriesnum;
      peVar10 = (envy_bios_mem_train_entry *)calloc((ulong)bVar2,0xc);
      (bios->mem).train.entries = peVar10;
      if (peVar10 == (envy_bios_mem_train_entry *)0x0) {
        iVar13 = -0xc;
      }
      else {
        if (bVar2 != 0) {
          puVar1 = &(bios->mem).train.subentries;
          uVar11 = (ulong)*puVar1;
          lVar9 = 3;
          uVar16 = 0;
          do {
            peVar10 = (bios->mem).train.entries;
            peVar17 = peVar10 + uVar16;
            uVar8 = (int)uVar16 *
                    ((uint)(bios->mem).train.subentrylen * (int)uVar11 +
                    (uint)(bios->mem).train.rlen) +
                    (uint)(bios->mem).train.hlen + (uint)(bios->mem).train.offset;
            peVar17->offset = (uint16_t)uVar8;
            uVar8 = uVar8 & 0xffff;
            if (uVar8 < bios->length) {
              peVar17->u00 = bios->data[uVar8];
              uVar8 = 0;
            }
            else {
              peVar17->u00 = '\0';
              fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
              uVar8 = 0xfffffff2;
            }
            if (8 < *puVar1) {
              envy_bios_parse_mem_train_cold_1();
              goto LAB_0025ba76;
            }
            if (*puVar1 == 0) {
              uVar11 = 0;
            }
            else {
              uVar14 = 1;
              do {
                if ((int)uVar14 + (uint)peVar17->offset < bios->length) {
                  peVar10->subentry[uVar14 + lVar9 + -4] = bios->data[uVar14 + peVar17->offset];
                  uVar12 = 0;
                }
                else {
                  peVar10->subentry[uVar14 + lVar9 + -4] = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar12 = 0xfffffff2;
                }
                uVar8 = uVar8 | uVar12;
                uVar11 = (ulong)*puVar1;
                bVar18 = uVar14 < uVar11;
                uVar14 = uVar14 + 1;
              } while (bVar18);
            }
            if (uVar8 != 0) goto LAB_0025ba76;
            uVar16 = uVar16 + 1;
            lVar9 = lVar9 + 0xc;
          } while (uVar16 < (bios->mem).train.entriesnum);
        }
        (bios->mem).train.valid = '\x01';
        iVar13 = 0;
      }
    }
    else {
LAB_0025ba76:
      iVar13 = -0xe;
    }
  }
  return iVar13;
}

Assistant:

int
envy_bios_parse_mem_train (struct envy_bios *bios) {
	struct envy_bios_mem_train *mt = &bios->mem.train;
	if (!mt->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mt->offset, &mt->version);
	err |= bios_u8(bios, mt->offset+1, &mt->hlen);
	err |= bios_u8(bios, mt->offset+2, &mt->rlen);
	err |= bios_u8(bios, mt->offset+3, &mt->subentrylen);
	err |= bios_u8(bios, mt->offset+4, &mt->subentries);
	err |= bios_u8(bios, mt->offset+5, &mt->entriesnum);
	if (err)
		return -EFAULT;
	bios_u16(bios, mt->offset+6, &mt->mclk);

	envy_bios_block(bios, mt->offset, mt->hlen + mt->rlen * mt->entriesnum, "MEM TRAIN", -1);
	mt->entries = calloc(mt->entriesnum, sizeof *mt->entries);
	if (!mt->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mt->entriesnum; i++) {
		struct envy_bios_mem_train_entry *entry = &mt->entries[i];
		entry->offset = mt->offset + mt->hlen + ((mt->rlen + mt->subentries * mt->subentrylen) * i);
		err |= bios_u8(bios, entry->offset, &entry->u00);
		if (mt->subentries > sizeof(entry->subentry)) {
			mt->subentries = sizeof(entry->subentry);
			ENVY_BIOS_ERR("Error when parsing mem train: subentries = %d > %zu\n", mt->subentries, sizeof(entry->subentry));
			return -EFAULT;
		}
		int j;
		for (j = 0; j < mt->subentries; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &entry->subentry[j]);
		}
		if (err)
			return -EFAULT;
	}
	mt->valid = 1;
	return 0;
}